

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_beta_decode_int(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  uint uVar2;
  int local_3c;
  int n;
  int i;
  int32_t *out_i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  if ((c->field_6).external.type == 0) {
    local_3c = 0;
    iVar1 = *out_size;
    for (; local_3c < iVar1; local_3c = local_3c + 1) {
      *(int *)(out + (long)local_3c * 4) = -(c->field_6).huffman.ncodes;
    }
  }
  else {
    local_3c = 0;
    iVar1 = *out_size;
    for (; local_3c < iVar1; local_3c = local_3c + 1) {
      uVar2 = get_bits_MSB(in,(c->field_6).beta.nbits);
      *(uint *)(out + (long)local_3c * 4) = uVar2 - (c->field_6).huffman.ncodes;
    }
  }
  return 0;
}

Assistant:

int cram_beta_decode_int(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;

    if (c->beta.nbits) {
	for (i = 0, n = *out_size; i < n; i++)
	    out_i[i] = get_bits_MSB(in, c->beta.nbits) - c->beta.offset;
    } else {
	for (i = 0, n = *out_size; i < n; i++)
	    out_i[i] = -c->beta.offset;
    }

    return 0;
}